

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_handle.cpp
# Opt level: O1

SysCallInt32Result cppnet::OsHandle::Connect(int64_t sockfd,Address *address)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  socklen_t __len;
  sockaddr_in addr;
  sockaddr local_2c;
  undefined4 local_14;
  
  if (address->_address_type == AT_IPV4) {
    local_2c.sa_family = 2;
    local_2c.sa_data._0_2_ = address->_port << 8 | address->_port >> 8;
    local_2c.sa_data._2_4_ = inet_addr((address->_ip)._M_dataplus._M_p);
    __len = 0x10;
  }
  else {
    local_2c.sa_data[2] = '\0';
    local_2c.sa_data[3] = '\0';
    local_2c.sa_data[4] = '\0';
    local_2c.sa_data[5] = '\0';
    local_14 = 0;
    local_2c.sa_family = 10;
    local_2c.sa_data._0_2_ = address->_port << 8 | address->_port >> 8;
    inet_pton(10,(address->_ip)._M_dataplus._M_p,local_2c.sa_data + 6);
    __len = 0x1c;
  }
  uVar1 = connect((int)sockfd,&local_2c,__len);
  if ((int)uVar1 < 0) {
    puVar2 = (uint *)__errno_location();
    uVar3 = (ulong)*puVar2 << 0x20;
  }
  else {
    uVar3 = 0;
  }
  return (SysCallInt32Result)(uVar1 | uVar3);
}

Assistant:

SysCallInt32Result OsHandle::Connect(int64_t sockfd, Address& address) {
    int32_t ret = -1;
    if (address.GetType() == AT_IPV4) {
        struct sockaddr_in addr;
        addr.sin_family = AF_INET;
        addr.sin_port = htons(address.GetAddrPort());
        addr.sin_addr.s_addr = inet_addr(address.GetIp().c_str());
        ret = connect(sockfd, (sockaddr *)&addr, sizeof(addr));

    } else {
        struct sockaddr_in6 addr;
        addr.sin6_flowinfo = 0;
        addr.sin6_scope_id = 0;
        addr.sin6_family = AF_INET6;
        addr.sin6_port = htons(address.GetAddrPort());
        inet_pton(AF_INET6, address.GetIp().c_str(), &addr.sin6_addr);
        ret = connect(sockfd, (sockaddr *)&addr, sizeof(addr));
    }

    if (ret < 0) {
        return {ret, errno};
    }
    return {ret, 0};
}